

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_quaternion_to_axis_angle(rf_quaternion q,rf_vec3 *outAxis,float *outAngle)

{
  float fVar1;
  float fVar2;
  double dVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 local_48;
  
  fVar4 = q.z;
  fVar6 = q.w;
  fVar2 = q.x;
  fVar5 = q.y;
  local_48 = q._0_8_;
  if (1.0 < ABS(fVar6)) {
    fVar1 = fVar6 * fVar6 + fVar4 * fVar4 + fVar2 * fVar2 + fVar5 * fVar5;
    if (fVar1 < 0.0) {
      fVar1 = sqrtf(fVar1);
    }
    else {
      fVar1 = SQRT(fVar1);
    }
    fVar1 = (float)(-(uint)(fVar1 == 0.0) & 0x3f800000 |
                   ~-(uint)(fVar1 == 0.0) & (uint)(1.0 / fVar1));
    local_48 = CONCAT44(fVar5 * fVar1,fVar2 * fVar1);
    fVar4 = fVar4 * fVar1;
    fVar6 = fVar6 * fVar1;
  }
  dVar3 = acos((double)fVar6);
  fVar2 = 1.0 - fVar6 * fVar6;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar5 = 1.0;
  if (0.0001 < fVar2) {
    fVar5 = (float)local_48 / fVar2;
  }
  if (0.0001 < fVar2) {
    fVar4 = fVar4 / fVar2;
  }
  else {
    fVar4 = 0.0;
  }
  outAxis->x = fVar5;
  outAxis->y = (float)(-(uint)(0.0001 < fVar2) & (uint)(local_48._4_4_ / fVar2));
  outAxis->z = fVar4;
  *outAngle = (float)dVar3 + (float)dVar3;
  return;
}

Assistant:

RF_API void rf_quaternion_to_axis_angle(rf_quaternion q, rf_vec3 *outAxis, float *outAngle)
{
    if (fabs(q.w) > 1.0f) q = rf_quaternion_normalize(q);

    rf_vec3 resAxis = {0.0f, 0.0f, 0.0f};
    float resAngle = 0.0f;

    resAngle = 2.0f * (float) acos(q.w);
    float den = (float) sqrt(1.0f - q.w * q.w);

    if (den > 0.0001f)
    {
        resAxis.x = q.x / den;
        resAxis.y = q.y / den;
        resAxis.z = q.z / den;
    } else
    {
        // This occurs when the angle is zero.
        // Not a problem: just set an arbitrary normalized axis.
        resAxis.x = 1.0f;
    }

    *outAxis = resAxis;
    *outAngle = resAngle;
}